

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O0

bool __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::set
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,uint64_t key,
          uint64_t val)

{
  bool bVar1;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *pcVar2;
  type_conflict *slot_id_00;
  uint64_t uVar3;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *slot_id_01;
  int __flags;
  void *__child_stack;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_RDI;
  void *in_R8;
  uint64_t slot_id;
  uint64_t empty_id;
  type_conflict *mod;
  type_conflict *quo;
  this_type new_cht;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffef4;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_fffffffffffffef8;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this_00;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_ffffffffffffff08;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_ffffffffffffffa0;
  
  this_00 = in_RDI;
  if (in_RDI->max_size_ <= in_RDI->size_) {
    in_stack_fffffffffffffef4 = size_p2::bits(&in_RDI->univ_size_);
    __flags = (int)in_RDI;
    size_p2::bits(&this_00->capa_size_);
    in_stack_fffffffffffffef8 =
         (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
         &stack0xffffffffffffff48;
    compact_hash_table(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                      );
    clone(this_00,(__fn *)in_stack_fffffffffffffef8,__child_stack,__flags,in_R8);
    operator=((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
              in_stack_fffffffffffffee8);
    ~compact_hash_table((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                        0x19c5eb);
  }
  bijective_hash::split_mix_hasher::hash
            ((split_mix_hasher *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (uint64_t)in_stack_fffffffffffffee8);
  decompose_(in_stack_ffffffffffffff10,(uint64_t)in_stack_ffffffffffffff08);
  pcVar2 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
           std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x19c63d)
  ;
  slot_id_00 = std::get<1ul,unsigned_long,unsigned_long>
                         ((pair<unsigned_long,_unsigned_long> *)0x19c64c);
  bVar1 = is_vacant_((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (uint64_t)in_stack_fffffffffffffee8);
  if (bVar1) {
    update_slot_(pcVar2,(uint64_t)slot_id_00,(uint64_t)in_stack_ffffffffffffff10,
                 (uint64_t)in_stack_ffffffffffffff08,SUB81((ulong)this_00 >> 0x38,0),
                 SUB81((ulong)this_00 >> 0x30,0));
    this_00->size_ = this_00->size_ + 1;
  }
  else {
    pcVar2 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)0x0;
    uVar3 = find_ass_cbit_(in_stack_ffffffffffffff08,(uint64_t)this_00,
                           (uint64_t *)in_stack_fffffffffffffef8);
    bVar1 = get_vbit_((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                      CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (uint64_t)in_stack_fffffffffffffee8);
    if (bVar1) {
      bVar1 = find_item_(in_stack_fffffffffffffef8,
                         (uint64_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (uint64_t)in_stack_fffffffffffffee8);
      if (bVar1) {
        set_val_(this_00,(uint64_t)in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        return false;
      }
      slot_id_01 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                   left_((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (uint64_t)in_stack_fffffffffffffee8);
      for (; pcVar2 != slot_id_01;
          pcVar2 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                   copy_from_right_(pcVar2,(uint64_t)slot_id_01)) {
      }
      set_cbit_(this_00,(uint64_t)in_stack_fffffffffffffef8,
                SUB41(in_stack_fffffffffffffef4 >> 0x18,0));
    }
    else {
      if (uVar3 == 0xffffffffffffffff) {
        slot_id_01 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                     0xffffffffffffffff;
      }
      else {
        do {
          right_((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (uint64_t)in_stack_fffffffffffffee8);
          bVar1 = get_cbit_((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *
                            )CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (uint64_t)in_stack_fffffffffffffee8);
        } while (((bVar1 ^ 0xffU) & 1) != 0);
        slot_id_01 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                     left_((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           (uint64_t)in_stack_fffffffffffffee8);
        for (; pcVar2 != slot_id_01;
            pcVar2 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                     copy_from_right_(pcVar2,(uint64_t)slot_id_01)) {
        }
      }
      set_vbit_(this_00,(uint64_t)in_stack_fffffffffffffef8,
                SUB41(in_stack_fffffffffffffef4 >> 0x18,0));
      set_cbit_(this_00,(uint64_t)in_stack_fffffffffffffef8,
                SUB41(in_stack_fffffffffffffef4 >> 0x18,0));
    }
    set_quo_(pcVar2,(uint64_t)slot_id_01,(uint64_t)this_00);
    set_val_(this_00,(uint64_t)in_stack_fffffffffffffef8,
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    this_00->size_ = this_00->size_ + 1;
  }
  return true;
}

Assistant:

bool set(uint64_t key, uint64_t val) {
        assert(key < univ_size_.size());
        assert(val < val_mask);

        if (max_size_ <= size_) {
            // expand
            this_type new_cht{univ_size_.bits(), capa_size_.bits() + 1};
#ifdef POPLAR_EXTRA_STATS
            new_cht.num_resize_ = num_resize_ + 1;
#endif
            clone(new_cht);
            *this = std::move(new_cht);
        }

        auto [quo, mod] = decompose_(hasher_.hash(key));

        if (is_vacant_(mod)) {
            // without collision
            update_slot_(mod, quo, val, true, true);
            ++size_;
            return true;
        }

        uint64_t empty_id = 0;
        uint64_t slot_id = find_ass_cbit_(mod, empty_id);

        if (!get_vbit_(mod)) {  // initial insertion in the group
            // create a new collision group
            if (slot_id != UINT64_MAX) {  // require to displace existing groups?
                do {
                    slot_id = right_(slot_id);
                } while (!get_cbit_(slot_id));

                slot_id = left_(slot_id);  // rightmost slot of the group

                while (empty_id != slot_id) {
                    empty_id = copy_from_right_(empty_id);
                }
            } else {
                // not inside other collision groups
            }
            set_vbit_(mod, true);
            set_cbit_(empty_id, true);
        } else {
            // collision group already exists
            if (find_item_(slot_id, quo)) {  // already registered?
                set_val_(slot_id, val);  // update
                return false;
            }

            slot_id = left_(slot_id);  // rightmost of the group

            // displace existing groups for creating an empty slot
            while (empty_id != slot_id) {
                empty_id = copy_from_right_(empty_id);
            }
            set_cbit_(empty_id, false);
        }

        set_quo_(empty_id, quo);
        set_val_(empty_id, val);

        ++size_;

        return true;
    }